

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tt2ps.cpp
# Opt level: O1

void __thiscall ConstructCffPath::Line(ConstructCffPath *this,json *cubicContour,Point p1)

{
  ConstructCffPath CVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  bool ret;
  Point p3;
  undefined1 local_58 [8];
  json_value local_50;
  double local_48;
  double local_40;
  double local_38;
  Point local_30;
  
  local_40 = p1.y;
  local_48 = p1.x;
  CVar1 = *this;
  uVar5 = (ulong)(byte)CVar1;
  if (CVar1 != (ConstructCffPath)0x0) {
    if (CVar1 == (ConstructCffPath)0x1) {
      uVar5 = *(ulong *)(*(long *)(this + 8) + 0x28);
    }
    else if (CVar1 == (ConstructCffPath)0x2) {
      uVar5 = (*(long **)(this + 8))[1] - **(long **)(this + 8) >> 4;
    }
    else {
      uVar5 = 1;
    }
  }
  if (1 < uVar5) {
    pvVar4 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)this,uVar5 - 2);
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar4,"on");
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (pvVar4,(boolean_t *)local_58);
    if (local_58[0] == true) {
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)this,uVar5 - 1);
      Point::Point((Point *)local_58,pvVar4);
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)this,uVar5 - 2);
      Point::Point(&local_30,pvVar4);
      dVar6 = local_30.y - local_40;
      dVar7 = local_48 - local_30.x;
      iVar3 = (int)((double)CONCAT71(local_58._1_7_,local_58[0]) * dVar6 +
                    local_50.number_float * dVar7 + (local_40 * local_30.x - local_30.y * local_48))
      ;
      iVar2 = -iVar3;
      if (0 < iVar3) {
        iVar2 = iVar3;
      }
      dVar6 = dVar6 * dVar6 + dVar7 * dVar7;
      if (dVar6 < 0.0) {
        local_38 = (double)iVar2;
        dVar6 = sqrt(dVar6);
        dVar7 = local_38;
      }
      else {
        dVar6 = SQRT(dVar6);
        dVar7 = (double)iVar2;
      }
      if (dVar7 / dVar6 < 1.0) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::erase((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)this,uVar5 - 1);
      }
    }
  }
  Point::ToJson_abi_cxx11_((Point *)local_58,SUB81(&local_48,0));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_58);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_58);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_58 + 8),local_58[0]);
  return;
}

Assistant:

void Line(json &cubicContour, Point p1)
{
	size_t length = cubicContour.size();
	if (length >= 2 && cubicContour[length - 2]["on"])
	{
		// 2 lines, merge if the are collinear.
		Point p2 = cubicContour[length - 1];
		Point p3 = cubicContour[length - 2];
		double a = p3.y - p1.y;
		double b = p1.x - p3.x;
		double c = p1.y * p3.x - p1.x * p3.y;
		double distance = abs(a * p2.x + b * p2.y + c) / sqrt(a * a + b * b);
		if (distance < 1)
			cubicContour.erase(length - 1);
	}
	cubicContour.push_back(p1.ToJson(true));
}